

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

void sobel_filter(uint8_t *src,int src_stride,int16_t *dx,int16_t *dy)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 *puVar3;
  long in_RCX;
  long in_RDX;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m256i dy_row;
  __m256i dx_row;
  __m256i row_0_p1_hdiff;
  __m256i row_p1_p2_hdiff;
  __m256i row_p1_p2_hsmooth;
  __m256i row_p1_p2_c;
  __m256i row_p1_p2_b;
  __m256i row_p1_p2_a;
  __m256i row_p1_p2;
  int i;
  __m256i row_m1_0_hdiff;
  __m256i row_m1_0_hsmooth;
  __m256i row_m1_0_c;
  __m256i row_m1_0_b;
  __m256i row_m1_0_a;
  __m256i row_m1_0;
  __m256i zero;
  undefined8 local_780;
  undefined8 uStackY_778;
  undefined8 uStackY_770;
  undefined8 uStackY_768;
  void *lo;
  undefined8 uStack_750;
  undefined1 local_760 [32];
  undefined8 uStack_748;
  int local_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  void *hi;
  
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  yy_loadu2_128(hi,lo);
  auVar9._8_8_ = uVar5;
  auVar9._0_8_ = uVar4;
  auVar9._16_8_ = uVar6;
  auVar9._24_8_ = uVar7;
  auVar1 = vpunpcklbw_avx2(auVar9,ZEXT1632(ZEXT816(0)));
  auVar8._8_8_ = uVar5;
  auVar8._0_8_ = uVar4;
  auVar8._16_8_ = uVar6;
  auVar8._24_8_ = uVar7;
  auVar8 = vpsrldq_avx2(auVar8,1);
  auVar9 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
  auVar2._8_8_ = uVar5;
  auVar2._0_8_ = uVar4;
  auVar2._16_8_ = uVar6;
  auVar2._24_8_ = uVar7;
  auVar8 = vpsrldq_avx2(auVar2,2);
  auVar2 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
  auVar8 = vpaddw_avx2(auVar1,auVar2);
  auVar9 = vpsllw_avx2(auVar9,ZEXT416(1));
  local_620 = vpaddw_avx2(auVar8,auVar9);
  local_640 = vpsubw_avx2(auVar1,auVar2);
  for (local_644 = 0; local_644 < 8; local_644 = local_644 + 2) {
    auVar8 = local_640;
    yy_loadu2_128(hi,lo);
    auVar1 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
    auVar9 = vpsrldq_avx2(auVar8,1);
    auVar9 = vpunpcklbw_avx2(auVar9,ZEXT1632(ZEXT816(0)));
    auVar8 = vpsrldq_avx2(auVar8,2);
    auVar2 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
    auVar8 = vpaddw_avx2(auVar1,auVar2);
    auVar9 = vpsllw_avx2(auVar9,ZEXT416(1));
    auVar8 = vpaddw_avx2(auVar8,auVar9);
    auVar2 = vpsubw_avx2(auVar1,auVar2);
    auVar1 = vperm2i128_avx2(local_640,auVar2,0x21);
    auVar9 = vpaddw_avx2(local_640,auVar2);
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    local_760 = vpaddw_avx2(auVar9,auVar1);
    auVar9 = vpsubw_avx2(local_620,auVar8);
    puVar3 = (undefined8 *)(in_RDX + (long)(local_644 << 3) * 2);
    *puVar3 = lo;
    puVar3[1] = hi;
    puVar3[2] = uStack_750;
    puVar3[3] = uStack_748;
    puVar3 = (undefined8 *)(in_RCX + (long)(local_644 << 3) * 2);
    local_780 = auVar9._0_8_;
    uStackY_778 = auVar9._8_8_;
    uStackY_770 = auVar9._16_8_;
    uStackY_768 = auVar9._24_8_;
    *puVar3 = local_780;
    puVar3[1] = uStackY_778;
    puVar3[2] = uStackY_770;
    puVar3[3] = uStackY_768;
    local_640 = auVar2;
    local_620 = auVar8;
  }
  return;
}

Assistant:

static inline void sobel_filter(const uint8_t *src, int src_stride,
                                int16_t *dst, int dst_stride, int dir) {
  int16_t tmp_[DISFLOW_PATCH_SIZE * (DISFLOW_PATCH_SIZE + 2)];
  int16_t *tmp = tmp_ + DISFLOW_PATCH_SIZE;

  // Sobel filter kernel
  // This must have an overall scale factor equal to DISFLOW_DERIV_SCALE,
  // in order to produce correctly scaled outputs.
  // To work out the scale factor, we multiply two factors:
  //
  // * For the derivative filter (sobel_a), comparing our filter
  //    image[x - 1] - image[x + 1]
  //   to the standard form
  //    d/dx image[x] = image[x+1] - image[x]
  //   tells us that we're actually calculating -2 * d/dx image[2]
  //
  // * For the smoothing filter (sobel_b), all coefficients are positive
  //   so the scale factor is just the sum of the coefficients
  //
  // Thus we need to make sure that DISFLOW_DERIV_SCALE = 2 * sum(sobel_b)
  // (and take care of the - sign from sobel_a elsewhere)
  static const int16_t sobel_a[3] = { 1, 0, -1 };
  static const int16_t sobel_b[3] = { 1, 2, 1 };
  const int taps = 3;

  // horizontal filter
  const int16_t *h_kernel = dir ? sobel_a : sobel_b;

  for (int y = -1; y < DISFLOW_PATCH_SIZE + 1; ++y) {
    for (int x = 0; x < DISFLOW_PATCH_SIZE; ++x) {
      int sum = 0;
      for (int k = 0; k < taps; ++k) {
        sum += h_kernel[k] * src[y * src_stride + (x + k - 1)];
      }
      tmp[y * DISFLOW_PATCH_SIZE + x] = sum;
    }
  }

  // vertical filter
  const int16_t *v_kernel = dir ? sobel_b : sobel_a;

  for (int y = 0; y < DISFLOW_PATCH_SIZE; ++y) {
    for (int x = 0; x < DISFLOW_PATCH_SIZE; ++x) {
      int sum = 0;
      for (int k = 0; k < taps; ++k) {
        sum += v_kernel[k] * tmp[(y + k - 1) * DISFLOW_PATCH_SIZE + x];
      }
      dst[y * dst_stride + x] = sum;
    }
  }
}